

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS6(Solution *solution)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this;
  reference ppVar5;
  Nurse *pNVar6;
  History *this_00;
  vector<Turn_*,_std::allocator<Turn_*>_> *this_01;
  size_type sVar7;
  Scenario *this_02;
  string *psVar8;
  string local_a0;
  undefined1 local_80 [8];
  Contract contract;
  int totalAssignments;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this = Solution::getNurses_abi_cxx11_(solution);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
           ::begin(this);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(this);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&nurse), bVar3) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
             ::operator*(&__end1);
    pNVar6 = NurseSolution::getNurse(ppVar5->second);
    this_00 = Nurse::getHistory(pNVar6);
    contract._60_4_ = History::getNumberOfAssignments(this_00);
    this_01 = NurseSolution::getTurns(ppVar5->second);
    sVar7 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(this_01);
    contract._60_4_ = contract._60_4_ + (int)sVar7;
    this_02 = Scenario::getInstance();
    pNVar6 = NurseSolution::getNurse(ppVar5->second);
    psVar8 = Nurse::getContract_abi_cxx11_(pNVar6);
    std::__cxx11::string::string((string *)&local_a0,(string *)psVar8);
    Scenario::getContract((Contract *)local_80,this_02,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    uVar1 = contract._60_4_;
    iVar4 = Contract::getMaximumNumberOfAssignments((Contract *)local_80);
    uVar2 = contract._60_4_;
    if (iVar4 < (int)uVar1) {
      iVar4 = Contract::getMaximumNumberOfAssignments((Contract *)local_80);
      __range1._4_4_ = (uVar2 - iVar4) * 0x14 + __range1._4_4_;
    }
    else {
      iVar4 = Contract::getMinimumNumberOfAssignments((Contract *)local_80);
      if ((int)uVar2 < iVar4) {
        iVar4 = Contract::getMinimumNumberOfAssignments((Contract *)local_80);
        __range1._4_4_ = (iVar4 - contract._60_4_) * 0x14 + __range1._4_4_;
      }
    }
    Contract::~Contract((Contract *)local_80);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int Validator::constraintS6(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int totalAssignments = nurse.second->getNurse()->getHistory().getNumberOfAssignments();
        totalAssignments += nurse.second->getTurns().size();
        Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());
        if(totalAssignments > contract.getMaximumNumberOfAssignments())
            sum += 20 * (totalAssignments-contract.getMaximumNumberOfAssignments());
        else if (totalAssignments < contract.getMinimumNumberOfAssignments())
            sum += 20 * (contract.getMinimumNumberOfAssignments() - totalAssignments);
    }
    return  sum;
}